

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_map.hpp
# Opt level: O1

bool __thiscall tcmalloc::PageMap::Set(PageMap *this,uint64_t key,void *value)

{
  bool bVar1;
  internal_type_help *__s;
  leaf_type_help *__s_00;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = key >> 0x2a;
  if (this->roots[uVar3] == (void ***)0x0) {
    __s = FixedAllocator<tcmalloc::PageMap::internal_type_help>::Alloc(&this->internal_allocator);
    if (__s == (internal_type_help *)0x0) {
      __s = (internal_type_help *)0x0;
    }
    else {
      memset(__s,0,0x400000);
    }
    this->roots[uVar3] = __s->ptrs;
    if (__s != (internal_type_help *)0x0) goto LAB_001059c9;
LAB_00105a3b:
    bVar1 = false;
  }
  else {
LAB_001059c9:
    uVar2 = (uint)(key >> 0x14) & 0x3fffff;
    if (this->roots[uVar3][uVar2] == (void **)0x0) {
      __s_00 = FixedAllocator<tcmalloc::PageMap::leaf_type_help>::Alloc(&this->leaf_allocator);
      if (__s_00 == (leaf_type_help *)0x0) {
        __s_00 = (leaf_type_help *)0x0;
      }
      else {
        memset(__s_00,0,0x100000);
      }
      *(leaf_type_help **)((long)this->roots[uVar3] + (ulong)(uVar2 * 8)) = __s_00;
      if (*(long *)((long)this->roots[uVar3] + (ulong)(uVar2 * 8)) == 0) goto LAB_00105a3b;
    }
    this->roots[uVar3][uVar2][(uint)key & 0xfffff] = value;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Set(uint64_t key, void *value) {
        uint64_t k1 = key >> (internal_bits + leaf_bits);
        uint64_t k2 = (key >> leaf_bits) & ((1<<internal_bits) - 1);
        uint64_t k3 = key & ((1<<leaf_bits) -1);
        if (roots[k1] == nullptr) {
            roots[k1] = reinterpret_cast<void ***>(Alloc(INTERNAL));
            if (roots[k1] == nullptr) {
                return false;
            }
        }
        if (roots[k1][k2] == nullptr) {
            roots[k1][k2] = reinterpret_cast<void **>(Alloc(LEAF));
            if (roots[k1][k2] == nullptr) {
                return false;
            }
        }
        roots[k1][k2][k3] = value;
        return true;
    }